

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.hpp
# Opt level: O2

long __thiscall
ylt::metric::basic_dynamic_counter<long,_(unsigned_char)'\x02'>::value
          (basic_dynamic_counter<long,_(unsigned_char)__x02_> *this,label_key_type labels_value)

{
  _func_int *p_Var1;
  shared_ptr<ylt::metric::dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_>::metric_pair>
  ptr;
  undefined1 local_18 [16];
  
  dynamic_metric_impl<std::atomic<long>,_(unsigned_char)'\x02'>::find
            ((dynamic_metric_impl<std::atomic<long>,_(unsigned_char)__x02_> *)local_18,
             (span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
              )this);
  if ((_func_int **)local_18._0_8_ == (_func_int **)0x0) {
    p_Var1 = (_func_int *)0x0;
  }
  else {
    p_Var1 = *(_func_int **)(local_18._0_8_ + 0x40);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  return (long)p_Var1;
}

Assistant:

value_type value(label_key_type labels_value) {
    if (auto ptr = Base::find(labels_value); ptr != nullptr) {
      return ptr->value.load(std::memory_order::relaxed);
    }
    else {
      return value_type{};
    }
  }